

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
Parser_parseResetsWithIssues_Test::~Parser_parseResetsWithIssues_Test
          (Parser_parseResetsWithIssues_Test *this)

{
  Parser_parseResetsWithIssues_Test *this_local;
  
  ~Parser_parseResetsWithIssues_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Parser, parseResetsWithIssues)
{
    const std::string in =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model name=\"\" xmlns=\"http://www.cellml.org/cellml/2.0#\" id=\"mid\">\n"
        "  <component name=\"component1\">\n"
        "    <variable name=\"variable1\" id=\"vid\" units=\"dimensionless\"/>\n" // reset variable not in the same component
        "  </component>\n"
        "  <component name=\"component2\" id=\"c2id\">\n"
        "    <variable name=\"variable2\" id=\"vid2\" units=\"dimensionless\"/>\n"
        "    <variable name=\"variable4\" id=\"vid4\" units=\"dimensionless\"/>\n"

        // variable1 does not exist in this component, variable3 does not exist at all
        "    <reset order=\"33\" variable=\"variable3\" test_variable=\"variable1\">\n"
        "      <test_value one_invalid_attribute=\"apples\">\n" // invalid attribute
        "        <math xmlns=\"http://www.w3.org/1998/Math/MathML\">\n"
        "          <apply>\n"
        "          <eq/>\n"
        "            <ci>C1</ci>\n"
        "            <apply>\n"
        "              <plus/>\n"
        "              <ci>A1</ci>\n"
        "              <ci>B1</ci>\n"
        "            </apply>\n"
        "          </apply>\n"
        "        </math>\n"
        "      </test_value>\n"
        "      <test_value>\n" // duplicated test_value block inside reset
        "        <math xmlns=\"http://www.w3.org/1998/Math/MathML\">\n"
        "          <apply />\n"
        "        </math>\n"
        "      </test_value>\n"
        "      <reset_value another_invalid_attribute=\"bananas\">\n" // invalid attribute
        "        <math xmlns=\"http://www.w3.org/1998/Math/MathML\">\n"
        "          <apply />\n"
        "        </math>\n"
        "      </reset_value>\n"
        "      <test_value>\n" // duplicated test_value block inside reset
        "        <math xmlns=\"http://www.w3.org/1998/Math/MathML\">\n"
        "          <apply />\n"
        "        </math>\n"
        "      </test_value>\n"
        "      <reset_value>\n"
        "        <math xmlns=\"http://www.w3.org/1998/Math/MathML\">\n"
        "          <apply />\n"
        "        </math>\n"
        "      </reset_value>\n" // duplicated reset_value block inside reset
        "    </reset>\n"

        // order not specified
        "    <reset variable=\"variable2\" test_variable=\"variable4\">\n"
        "      lost text here\n"
        "      <test_value>\n"
        "        <some_invalid_tag/>\n" // test_value should only contain MathML
        "      </test_value>\n"
        "      <reset_value>\n"
        "        <some_other_invalid_tag/>\n" // reset_value should only contain MathML
        "      </reset_value>\n"
        "    </reset>\n"

        // order not specified, unknown attribute
        "    <reset variable=\"variable2\" test_variable=\"variable4\" i_dont_belong_here=\"yep_really_i_dont\">\n"

        // test_value missing
        // reset_value missing
        "    </reset>\n"
        "  </component>\n"
        "</model>\n";

    const std::vector<std::string> expectedIssues = {
        "Reset referencing variable 'variable3' is not a valid reference for a variable in component 'component2'.",
        "Reset referencing test_variable 'variable1' is not a valid reference for a variable in component 'component2'.",
        "Reset in component 'component2' referencing variable '' and test_variable '' has an unexpected attribute in the test_value block of 'one_invalid_attribute'.",
        "Reset in component 'component2' referencing variable '' and test_variable '' has an unexpected attribute in the reset_value block of 'another_invalid_attribute'.",
        "Reset in component 'component2' referencing variable '' and test_variable '' has 3 test_value blocks.",
        "Reset in component 'component2' referencing variable '' and test_variable '' has 2 reset_value blocks.",
        "Reset in component 'component2' does not have its order set.",
        "Reset has an invalid non-whitespace child text element '\n      lost text here\n      '. Either a test_value block or a reset_value block is expected.",
        "The test_value in the reset in component 'component2' referencing variable 'variable2' and test_variable 'variable4' should have a MathML block as a child.",
        "The reset_value in the reset in component 'component2' referencing variable 'variable2' and test_variable 'variable4' should have a MathML block as a child.",
        "Reset in component 'component2' has an invalid attribute 'i_dont_belong_here'.",
        "Reset in component 'component2' does not have its order set.",
        "Reset in component 'component2' referencing variable 'variable2' and test_variable 'variable4' does not have a test_value block defined.",
        "Reset in component 'component2' referencing variable 'variable2' and test_variable 'variable4' does not have a reset_value block defined.",
    };

    libcellml::ParserPtr p = libcellml::Parser::create();
    libcellml::ModelPtr model = p->parseModel(in);

    libcellml::ResetPtr resetExpected = model->component(1)->reset(0);

    EXPECT_EQ_ISSUES(expectedIssues, p);

    EXPECT_EQ(resetExpected, p->issue(0)->item()->reset());
}